

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::HelpCommand(UCIAdapter *this,char *param_1)

{
  Output *pOVar1;
  Output local_130;
  Output local_128;
  Output local_120;
  Output local_118;
  Output local_110;
  Output local_108;
  Output local_100;
  Output local_f8;
  Output local_f0;
  Output local_e8;
  Output local_e0;
  Output local_d8;
  Output local_d0;
  Output local_c8;
  Output local_c0;
  Output local_b8;
  Output local_b0;
  Output local_a8;
  Output local_a0;
  Output local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [35];
  char local_4d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  Output local_20;
  char *local_18;
  char *param_1_local;
  UCIAdapter *this_local;
  
  local_18 = param_1;
  param_1_local = (char *)this;
  Output::Output(&local_20,InfoPrefix);
  (**this->engine->_vptr_ChessEngine)(local_40);
  pOVar1 = Output::operator<<(&local_20,local_40);
  local_4d[0] = ' ';
  pOVar1 = Output::operator<<(pOVar1,local_4d);
  (*this->engine->_vptr_ChessEngine[1])(local_70);
  pOVar1 = Output::operator<<(pOVar1,local_70);
  pOVar1 = Output::operator<<(pOVar1,(char (*) [5])" by ");
  (*this->engine->_vptr_ChessEngine[2])(local_90);
  Output::operator<<(pOVar1,local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_40);
  Output::~Output(&local_20);
  Output::Output(&local_98,InfoPrefix);
  Output::operator<<(&local_98,(char (*) [14])"UCI commands:");
  Output::~Output(&local_98);
  Output::Output(&local_a0,InfoPrefix);
  pOVar1 = Output::operator<<(&local_a0,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Debug_abi_cxx11_);
  Output::~Output(&local_a0);
  Output::Output(&local_a8,InfoPrefix);
  pOVar1 = Output::operator<<(&local_a8,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Go_abi_cxx11_);
  Output::~Output(&local_a8);
  Output::Output(&local_b0,InfoPrefix);
  pOVar1 = Output::operator<<(&local_b0,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::IsReady_abi_cxx11_);
  Output::~Output(&local_b0);
  Output::Output(&local_b8,InfoPrefix);
  pOVar1 = Output::operator<<(&local_b8,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Position_abi_cxx11_);
  Output::~Output(&local_b8);
  Output::Output(&local_c0,InfoPrefix);
  pOVar1 = Output::operator<<(&local_c0,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Quit_abi_cxx11_);
  Output::~Output(&local_c0);
  Output::Output(&local_c8,InfoPrefix);
  pOVar1 = Output::operator<<(&local_c8,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::SetOption_abi_cxx11_);
  Output::~Output(&local_c8);
  Output::Output(&local_d0,InfoPrefix);
  pOVar1 = Output::operator<<(&local_d0,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Stop_abi_cxx11_);
  Output::~Output(&local_d0);
  Output::Output(&local_d8,InfoPrefix);
  pOVar1 = Output::operator<<(&local_d8,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Uci_abi_cxx11_);
  Output::~Output(&local_d8);
  Output::Output(&local_e0,InfoPrefix);
  pOVar1 = Output::operator<<(&local_e0,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::UciNewGame_abi_cxx11_);
  Output::~Output(&local_e0);
  Output::Output(&local_e8,InfoPrefix);
  Output::operator<<(&local_e8,(char (*) [21])"Additional commands:");
  Output::~Output(&local_e8);
  Output::Output(&local_f0,InfoPrefix);
  pOVar1 = Output::operator<<(&local_f0,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Exit_abi_cxx11_);
  Output::~Output(&local_f0);
  Output::Output(&local_f8,InfoPrefix);
  pOVar1 = Output::operator<<(&local_f8,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Fen_abi_cxx11_);
  Output::~Output(&local_f8);
  Output::Output(&local_100,InfoPrefix);
  pOVar1 = Output::operator<<(&local_100,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Help_abi_cxx11_);
  Output::~Output(&local_100);
  Output::Output(&local_108,InfoPrefix);
  pOVar1 = Output::operator<<(&local_108,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::New_abi_cxx11_);
  Output::~Output(&local_108);
  Output::Output(&local_110,InfoPrefix);
  pOVar1 = Output::operator<<(&local_110,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Perft_abi_cxx11_);
  Output::~Output(&local_110);
  Output::Output(&local_118,InfoPrefix);
  pOVar1 = Output::operator<<(&local_118,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Print_abi_cxx11_);
  Output::~Output(&local_118);
  Output::Output(&local_120,InfoPrefix);
  pOVar1 = Output::operator<<(&local_120,(char (*) [3])0x1649cf);
  Output::operator<<(pOVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            token::Test_abi_cxx11_);
  Output::~Output(&local_120);
  Output::Output(&local_128,InfoPrefix);
  Output::operator<<(&local_128,
                     (char (*) [57])"Also try \'<command> help\' for help on a specific command");
  Output::~Output(&local_128);
  Output::Output(&local_130,InfoPrefix);
  Output::operator<<(&local_130,
                     (char (*) [56])"Or enter move(s) in coordinate notation, e.g. d2d4 g8f6");
  Output::~Output(&local_130);
  return;
}

Assistant:

void UCIAdapter::HelpCommand(const char* /*params*/)
{
  Output() << engine->GetEngineName() << ' ' << engine->GetEngineVersion()
           << " by " << engine->GetAuthorName();
  Output() << "UCI commands:";
  Output() << "  " << token::Debug;
  Output() << "  " << token::Go;
  Output() << "  " << token::IsReady;
  Output() << "  " << token::Position;
  Output() << "  " << token::Quit;
  Output() << "  " << token::SetOption;
  Output() << "  " << token::Stop;
  Output() << "  " << token::Uci;
  Output() << "  " << token::UciNewGame;
  Output() << "Additional commands:";
  Output() << "  " << token::Exit;
  Output() << "  " << token::Fen;
  Output() << "  " << token::Help;
  Output() << "  " << token::New;
  Output() << "  " << token::Perft;
  Output() << "  " << token::Print;
  Output() << "  " << token::Test;
  Output() << "Also try '<command> help' for help on a specific command";
  Output() << "Or enter move(s) in coordinate notation, e.g. d2d4 g8f6";
}